

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

void __thiscall
xmrig::CudaBackendPrivate::CudaBackendPrivate(CudaBackendPrivate *this,Controller *controller)

{
  Config *this_00;
  CudaConfig *ctx;
  Base *in_RSI;
  CudaBackendPrivate *in_RDI;
  
  (((vector<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
     *)&in_RDI->controller)->
  super__Vector_base<xmrig::Thread<xmrig::CudaLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CudaLaunchData>_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)in_RSI;
  CudaLaunchStatus::CudaLaunchStatus(&in_RDI->status);
  std::vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>::vector
            ((vector<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_> *)0x22425c);
  std::vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_>::vector
            ((vector<xmrig::CudaLaunchData,_std::allocator<xmrig::CudaLaunchData>_> *)0x22426f);
  in_RDI->driverVersion = 0;
  in_RDI->runtimeVersion = 0;
  Workers<xmrig::CudaLaunchData>::Workers((Workers<xmrig::CudaLaunchData> *)in_RDI);
  this_00 = Base::config(in_RSI);
  ctx = Config::cuda(this_00);
  init(in_RDI,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

inline CudaBackendPrivate(Controller *controller) :
        controller(controller)
    {
        init(controller->config()->cuda());
    }